

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

int __thiscall
MemoryProfiler::CreateArenaUsageSummary
          (MemoryProfiler *this,ArenaAllocator *alloc,bool liveOnly,LPWSTR **name_ptr,
          ArenaMemoryDataSummary ***summaries_ptr)

{
  code *pcVar1;
  anon_class_16_2_d7055579_for_fn fn;
  bool bVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  ArenaMemoryDataSummary **ppAVar4;
  ArenaMemoryDataSummary *__dest;
  undefined8 *in_FS_OFFSET;
  TrackAllocData local_158;
  code *local_130;
  undefined8 local_128;
  TrackAllocData local_120;
  ArenaMemoryDataSummary *local_f8;
  ArenaMemoryDataSummary *localSummary;
  ArenaMemoryData *data;
  ArenaMemoryDataSummary *summary;
  code *pcStack_d8;
  int j;
  undefined8 local_d0;
  TrackAllocData local_c8;
  anon_class_1_0_00000001 local_99;
  int *local_98;
  ArenaMemoryDataSummary **local_90;
  int local_84;
  code *pcStack_80;
  int i;
  undefined8 local_78;
  TrackAllocData local_70;
  int local_44;
  LPWSTR **pppWStack_40;
  int count;
  ArenaMemoryDataSummary ***summaries;
  LPWSTR **name;
  ArenaMemoryDataSummary ***summaries_ptr_local;
  LPWSTR **name_ptr_local;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAStack_18;
  bool liveOnly_local;
  ArenaAllocator *alloc_local;
  MemoryProfiler *this_local;
  
  name = (LPWSTR **)summaries_ptr;
  summaries_ptr_local = (ArenaMemoryDataSummary ***)name_ptr;
  name_ptr_local._7_1_ = liveOnly;
  pAStack_18 = &alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  alloc_local = (ArenaAllocator *)this;
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                       ,0x12a,"(alloc)","alloc");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  summaries = summaries_ptr_local;
  pppWStack_40 = name;
  local_44 = JsUtil::
             BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Count(&this->arenaDataMap);
  pAVar3 = pAStack_18;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&char16_t*::typeinfo,0,(long)local_44,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
             ,0x130);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_70);
  pcStack_80 = Memory::ArenaAllocator::Alloc;
  local_78 = 0;
  ppAVar4 = (ArenaMemoryDataSummary **)
            Memory::AllocateArray<Memory::ArenaAllocator,char16_t*,false>
                      ((Memory *)pAVar3,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                       (long)local_44);
  *summaries = ppAVar4;
  local_84 = 0;
  local_98 = &local_84;
  local_90 = *summaries;
  fn.name = (LPWSTR *)local_90;
  fn.i = local_98;
  JsUtil::
  BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Map<MemoryProfiler::CreateArenaUsageSummary(Memory::ArenaAllocator*,bool,char16_t***,ArenaMemoryDataSummary***)::__0>
            ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->arenaDataMap,fn);
  qsort_s<char16_t*,char16_t*,Memory::Recycler,MemoryProfiler::CreateArenaUsageSummary(Memory::ArenaAllocator*,bool,char16_t***,ArenaMemoryDataSummary***)::__1>
            ((char16_t **)*summaries,(long)local_44,8,&local_99,(void *)0x0);
  pAVar3 = pAStack_18;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c8,(type_info *)&ArenaMemoryDataSummary*::typeinfo,0,(long)local_44,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
             ,0x139);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_c8);
  pcStack_d8 = Memory::ArenaAllocator::Alloc;
  local_d0 = 0;
  ppAVar4 = Memory::AllocateArray<Memory::ArenaAllocator,ArenaMemoryDataSummary*,false>
                      ((Memory *)pAVar3,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                       (long)local_44);
  *pppWStack_40 = (LPWSTR *)ppAVar4;
  summary._4_4_ = 0;
  do {
    if (local_44 <= summary._4_4_) {
      return local_44;
    }
    data = (ArenaMemoryData *)
           JsUtil::
           BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(&this->arenaDataMap,(char16_t **)(*summaries + summary._4_4_));
    pAVar3 = pAStack_18;
    localSummary = (ArenaMemoryDataSummary *)((ArenaMemoryDataSummary *)data)->data;
    if ((name_ptr_local._7_1_ & 1) == 0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_158,(type_info *)&ArenaMemoryDataSummary::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                 ,0x14c);
      pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar3,&local_158);
      __dest = (ArenaMemoryDataSummary *)
               new<Memory::ArenaAllocator>(0xd8,(ArenaAllocator *)pAVar3,0x223270);
      memcpy(__dest,data,0xd8);
      local_f8 = __dest;
LAB_003c6bd3:
      for (; localSummary != (ArenaMemoryDataSummary *)0x0;
          localSummary = (ArenaMemoryDataSummary *)(localSummary->total).resetCount) {
        local_f8->outstandingCount = local_f8->outstandingCount + 1;
        AccumulateData(local_f8,(ArenaMemoryData *)localSummary,false);
      }
      if ((name_ptr_local._7_1_ & 1) != 0) {
        local_f8->arenaCount = local_f8->outstandingCount;
      }
      (*pppWStack_40)[summary._4_4_] = (LPWSTR)local_f8;
    }
    else {
      if (localSummary != (ArenaMemoryDataSummary *)0x0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_120,(type_info *)&ArenaMemoryDataSummary::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                   ,0x148);
        pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar3,&local_120);
        local_130 = Memory::ArenaAllocator::AllocZero;
        local_128 = 0;
        local_f8 = (ArenaMemoryDataSummary *)
                   new<Memory::ArenaAllocator>(0xd8,(ArenaAllocator *)pAVar3,0x3c9da0);
        goto LAB_003c6bd3;
      }
      (*pppWStack_40)[summary._4_4_] = (LPWSTR)0x0;
    }
    summary._4_4_ = summary._4_4_ + 1;
  } while( true );
}

Assistant:

int MemoryProfiler::CreateArenaUsageSummary(ArenaAllocator * alloc, bool liveOnly,
    _Outptr_result_buffer_(return) LPWSTR ** name_ptr, _Outptr_result_buffer_(return) ArenaMemoryDataSummary *** summaries_ptr)
{
    Assert(alloc);

    LPWSTR *& name = *name_ptr;
    ArenaMemoryDataSummary **& summaries = *summaries_ptr;

    int count = arenaDataMap.Count();
    name = AnewArray(alloc, LPWSTR, count);
    int i = 0;
    arenaDataMap.Map([&i, name](LPWSTR key, ArenaMemoryDataSummary*)
    {
        name[i++] = key;
    });

    qsort_s(name, count, sizeof(LPWSTR), [](void*, const void* a, const void* b) { return DefaultComparer<LPWSTR>::Compare(*(LPWSTR*)a, *(LPWSTR*)b); }, nullptr);

    summaries = AnewArray(alloc, ArenaMemoryDataSummary *, count);

    for (int j = 0; j < count; j++)
    {
        ArenaMemoryDataSummary * summary = arenaDataMap.Item(name[j]);
        ArenaMemoryData * data = summary->data;

        ArenaMemoryDataSummary * localSummary;
        if (liveOnly)
        {
            if (data == nullptr)
            {
                summaries[j] = nullptr;
                continue;
            }
            localSummary = AnewStructZ(alloc, ArenaMemoryDataSummary);
        }
        else
        {
            localSummary = Anew(alloc, ArenaMemoryDataSummary, *summary);
        }

        while (data != nullptr)
        {
            localSummary->outstandingCount++;
            AccumulateData(localSummary, data);
            data = data->next;
        }

        if (liveOnly)
        {
            localSummary->arenaCount = localSummary->outstandingCount;
        }
        summaries[j] = localSummary;
    }

    return count;
}